

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ClampWindowRect(ImGuiWindow *window,ImRect *visibility_rect)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  ImVec2 IVar5;
  float fVar6;
  ImVec2 IVar7;
  
  fVar6 = (window->Size).x;
  fVar4 = (window->Size).y;
  if (((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((window->Flags & 1) == 0)) {
    fVar4 = ImGuiWindow::TitleBarHeight(window);
  }
  fVar4 = (visibility_rect->Min).y - fVar4;
  IVar7 = visibility_rect->Max;
  fVar1 = (window->Pos).x;
  fVar2 = (window->Pos).y;
  if ((fVar4 <= fVar2) && (fVar4 = IVar7.y, fVar2 <= IVar7.y)) {
    fVar4 = fVar2;
  }
  fVar6 = (visibility_rect->Min).x - fVar6;
  if (fVar1 <= IVar7.x) {
    IVar7.x = fVar1;
  }
  uVar3 = -(uint)(fVar1 < fVar6);
  IVar5.x = (float)(~uVar3 & (uint)IVar7.x | (uint)fVar6 & uVar3);
  IVar5.y = fVar4;
  window->Pos = IVar5;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& visibility_rect)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = window->Size;
    if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar))
        size_for_clamping.y = window->TitleBarHeight();
    window->Pos = ImClamp(window->Pos, visibility_rect.Min - size_for_clamping, visibility_rect.Max);
}